

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterRowkey(VdbeCursor *pCsr,Mem *pOut)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int nKey;
  void *pKey;
  VdbeSorter *pSorter;
  Mem *in_stack_ffffffffffffffc8;
  int local_2c;
  void *local_28;
  VdbeSorter *local_20;
  long local_18;
  int local_4;
  
  local_20 = *(VdbeSorter **)(in_RDI + 0x48);
  local_18 = in_RSI;
  local_28 = vdbeSorterRowkey(local_20,&local_2c);
  iVar1 = sqlite3VdbeMemClearAndResize(in_stack_ffffffffffffffc8,0);
  if (iVar1 == 0) {
    *(int *)(local_18 + 0xc) = local_2c;
    *(ushort *)(local_18 + 8) = *(ushort *)(local_18 + 8) & 0xbe00 | 0x10;
    memcpy(*(void **)(local_18 + 0x10),local_28,(long)local_2c);
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRowkey(const VdbeCursor *pCsr, Mem *pOut){
  VdbeSorter *pSorter = pCsr->pSorter;
  void *pKey; int nKey;           /* Sorter key to copy into pOut */

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  if( sqlite3VdbeMemClearAndResize(pOut, nKey) ){
    return SQLITE_NOMEM;
  }
  pOut->n = nKey;
  MemSetTypeFlag(pOut, MEM_Blob);
  memcpy(pOut->z, pKey, nKey);

  return SQLITE_OK;
}